

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O3

QModelIndex * __thiscall
QTableView::moveCursor
          (QModelIndex *__return_storage_ptr__,QTableView *this,CursorAction cursorAction,
          KeyboardModifiers modifiers)

{
  QPersistentModelIndex *this_00;
  QSpanCollection *pQVar1;
  QTableViewPrivate *this_01;
  QWidgetData *pQVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  Representation RVar11;
  Representation RVar12;
  LayoutDirection LVar13;
  int iVar14;
  int iVar15;
  Representation column;
  Representation row;
  Span *pSVar16;
  long lVar17;
  int extraout_var;
  ulong uVar18;
  bool bVar19;
  int iVar20;
  QPoint QVar21;
  QPoint QVar22;
  int iVar23;
  int extraout_var_00;
  int iVar24;
  QAbstractItemModel *pQVar25;
  QTableViewPrivate *pQVar26;
  QTableViewPrivate *this_02;
  SearchDirection searchDirection;
  uint uVar27;
  long in_FS_OFFSET;
  QModelIndex local_88;
  QModelIndex local_70;
  QModelIndex local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QTableViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  pQVar25 = (this_01->super_QAbstractItemViewPrivate).model;
  this_00 = &(this_01->super_QAbstractItemViewPrivate).root;
  QPersistentModelIndex::operator_cast_to_QModelIndex(&local_58,this_00);
  iVar8 = (**(code **)(*(long *)pQVar25 + 0x78))(pQVar25,&local_58);
  do {
    iVar14 = iVar8;
    iVar8 = iVar14 + -1;
    if (iVar14 < 1) break;
    iVar9 = QHeaderView::logicalIndex(this_01->verticalHeader,iVar8);
    bVar4 = QHeaderView::isSectionHidden
                      (*(QHeaderView **)
                        (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                   super_QFrame.super_QWidget.field_0x8 + 0x588),iVar9);
  } while (bVar4);
  pQVar25 = (this_01->super_QAbstractItemViewPrivate).model;
  QPersistentModelIndex::operator_cast_to_QModelIndex(&local_58,this_00);
  uVar10 = (**(code **)(*(long *)pQVar25 + 0x80))(pQVar25,&local_58);
  do {
    uVar3 = uVar10;
    if ((int)uVar3 < 1) break;
    iVar9 = QHeaderView::logicalIndex(this_01->horizontalHeader,uVar3 - 1);
    bVar4 = QHeaderView::isSectionHidden
                      (*(QHeaderView **)
                        (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                   super_QFrame.super_QWidget.field_0x8 + 0x580),iVar9);
    uVar10 = uVar3 - 1;
  } while (bVar4);
  uVar10 = uVar3 - 1;
  if ((iVar8 == -1) || (uVar3 == 0)) goto LAB_005885f8;
  local_88.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemView::currentIndex(&local_88,(QAbstractItemView *)this);
  if ((local_88.r < 0) ||
     (((long)local_88._0_8_ < 0 || (local_88.m.ptr == (QAbstractItemModel *)0x0)))) {
    uVar18 = 0;
    if (1 < (int)uVar3) {
      uVar18 = 0;
      do {
        iVar14 = QHeaderView::logicalIndex(this_01->horizontalHeader,(int)uVar18);
        bVar4 = QHeaderView::isSectionHidden
                          (*(QHeaderView **)
                            (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                       super_QFrame.super_QWidget.field_0x8 + 0x580),iVar14);
        if (!bVar4) goto LAB_005878f7;
        uVar27 = (int)uVar18 + 1;
        uVar18 = (ulong)uVar27;
      } while (uVar3 - 1 != uVar27);
      uVar18 = (ulong)uVar10;
    }
LAB_005878f7:
    QVar21 = (QPoint)(uVar18 | 0xffffffff00000000);
    iVar14 = -1;
    do {
      QVar21 = (QPoint)((long)QVar21 + 0x100000000);
      iVar14 = iVar14 + 1;
      iVar9 = QHeaderView::logicalIndex(this_01->verticalHeader,iVar14);
      bVar4 = QHeaderView::isSectionHidden
                        (*(QHeaderView **)
                          (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                     super_QFrame.super_QWidget.field_0x8 + 0x588),iVar9);
      if (!bVar4) break;
    } while (iVar14 < iVar8);
    this_01->visualCursor = QVar21;
    pQVar25 = (this_01->super_QAbstractItemViewPrivate).model;
    iVar14 = QHeaderView::logicalIndex(this_01->verticalHeader,iVar14);
    iVar8 = QHeaderView::logicalIndex(this_01->horizontalHeader,(int)uVar18);
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_58,this_00);
    lVar17 = *(long *)pQVar25;
    goto LAB_005879a6;
  }
  RVar11.m_i = QHeaderView::visualIndex(this_01->horizontalHeader,local_88.c);
  RVar12.m_i = QHeaderView::visualIndex(this_01->verticalHeader,local_88.r);
  uVar27 = (this_01->visualCursor).xp.m_i;
  iVar9 = (this_01->visualCursor).yp.m_i;
  row.m_i = RVar12.m_i;
  column.m_i = RVar11.m_i;
  if (RVar12.m_i != iVar9 || RVar11.m_i != uVar27) {
    if ((QSpanCollection *)
        (this_01->spans).spans.
        super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>._M_impl.
        _M_node.super__List_node_base._M_next != &this_01->spans) {
      iVar15 = local_88.r;
      iVar24 = local_88.c;
      pSVar16 = QSpanCollection::spanAt(&this_01->spans,local_88.c,local_88.r);
      iVar23 = iVar15;
      iVar20 = iVar24;
      if (pSVar16 != (Span *)0x0) {
        iVar15 = pSVar16->m_top;
        iVar24 = pSVar16->m_left;
        iVar23 = pSVar16->m_bottom;
        iVar20 = pSVar16->m_right;
      }
      if ((((iVar15 <= iVar9) && (iVar9 <= iVar23)) && (iVar24 <= (int)uVar27)) &&
         (row.m_i = iVar9, column.m_i = uVar27, (int)uVar27 <= iVar20)) goto LAB_00587851;
    }
    QVar21.yp.m_i = RVar12.m_i;
    QVar21.xp.m_i = RVar11.m_i;
    this_01->visualCursor = QVar21;
    row.m_i = RVar12.m_i;
    column.m_i = RVar11.m_i;
  }
LAB_00587851:
  if (iVar14 <= row.m_i) {
    row.m_i = iVar8;
  }
  if ((int)uVar3 <= column.m_i) {
    column.m_i = uVar10;
  }
  LVar13 = QWidget::layoutDirection((QWidget *)this);
  if (LVar13 != RightToLeft) {
    switch(cursorAction) {
    case MoveUp:
      goto switchD_005878a6_caseD_0;
    case MoveDown:
      goto switchD_005878a6_caseD_1;
    case MoveLeft:
    case MovePrevious:
      goto switchD_005878a6_caseD_9;
    case MoveRight:
    case MoveNext:
      goto switchD_005878a6_caseD_8;
    case MoveHome:
      goto switchD_005878a6_caseD_4;
    case MoveEnd:
      goto switchD_005878a6_caseD_5;
    case MovePageUp:
      goto switchD_005878a6_caseD_6;
    case MovePageDown:
      goto switchD_005878a6_caseD_7;
    }
    goto switchD_005878a6_default;
  }
  bVar4 = true;
  switch(cursorAction) {
  case MoveUp:
switchD_005878a6_caseD_0:
    iVar8 = QHeaderView::logicalIndex(this_01->verticalHeader,row.m_i);
    iVar14 = QHeaderView::logicalIndex(this_01->horizontalHeader,column.m_i);
    iVar9 = row.m_i;
    if ((iVar8 != -1) &&
       ((QSpanCollection *)
        (this_01->spans).spans.
        super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>._M_impl.
        _M_node.super__List_node_base._M_next != &this_01->spans)) {
      pSVar16 = QSpanCollection::spanAt(&this_01->spans,iVar14,iVar8);
      iVar24 = iVar14;
      iVar15 = iVar8;
      if (pSVar16 != (Span *)0x0) {
        iVar15 = pSVar16->m_top;
        iVar24 = pSVar16->m_left;
        iVar8 = pSVar16->m_bottom;
        iVar14 = pSVar16->m_right;
      }
      if ((1 < (iVar14 - iVar24) + 1) || (1 < (iVar8 - iVar15) + 1)) {
        iVar9 = QHeaderView::visualIndex(this_01->verticalHeader,iVar15);
      }
    }
    if (-1 < iVar9) {
      iVar9 = iVar9 + -1;
      iVar8 = QHeaderView::logicalIndex(this_01->verticalHeader,iVar9);
      iVar14 = QHeaderView::logicalIndex(this_01->horizontalHeader,column.m_i);
      while (iVar8 != -1) {
        bVar4 = QHeaderView::isSectionHidden
                          (*(QHeaderView **)
                            (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                       super_QFrame.super_QWidget.field_0x8 + 0x588),iVar8);
        if (!bVar4) {
          pQVar25 = (this_01->super_QAbstractItemViewPrivate).model;
          QPersistentModelIndex::operator_cast_to_QModelIndex(&local_70,this_00);
          (**(code **)(*(long *)pQVar25 + 0x60))(&local_58,pQVar25,iVar8,iVar14,&local_70);
          pQVar25 = (this_01->super_QAbstractItemViewPrivate).model;
          uVar18 = (**(code **)(*(long *)pQVar25 + 0x138))(pQVar25,&local_58);
          if ((uVar18 & 0x20) != 0) break;
        }
        if (iVar9 == -1) break;
        iVar9 = iVar9 + -1;
        iVar8 = QHeaderView::logicalIndex(this_01->verticalHeader,iVar9);
        iVar14 = QHeaderView::logicalIndex(this_01->horizontalHeader,column.m_i);
      }
    }
    if (-1 < iVar9) {
      row.m_i = iVar9;
    }
    break;
  case MoveDown:
switchD_005878a6_caseD_1:
    pQVar26 = (QTableViewPrivate *)&this_01->spans;
    iVar8 = row.m_i;
    if ((QTableViewPrivate *)
        (this_01->spans).spans.
        super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>._M_impl.
        _M_node.super__List_node_base._M_next != pQVar26) {
      iVar9 = local_88.r;
      this_02 = pQVar26;
      pSVar16 = QSpanCollection::spanAt((QSpanCollection *)pQVar26,local_88.c,local_88.r);
      iVar8 = iVar9;
      if (pSVar16 != (Span *)0x0) {
        iVar8 = pSVar16->m_top;
        iVar9 = pSVar16->m_bottom;
      }
      iVar8 = QTableViewPrivate::sectionSpanEndLogical
                        (this_02,this_01->verticalHeader,iVar8,(iVar9 - iVar8) + 1);
      iVar8 = QHeaderView::visualIndex(this_01->verticalHeader,iVar8);
    }
    iVar9 = QHeaderView::logicalIndex(this_01->verticalHeader,iVar8);
    iVar15 = QHeaderView::logicalIndex(this_01->horizontalHeader,column.m_i);
    if ((iVar9 != -1) &&
       ((QTableViewPrivate *)
        (((QSpanCollection *)pQVar26)->spans).
        super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>._M_impl.
        _M_node.super__List_node_base._M_next != pQVar26)) {
      pSVar16 = QSpanCollection::spanAt((QSpanCollection *)pQVar26,iVar15,iVar9);
      iVar23 = iVar15;
      iVar24 = iVar9;
      if (pSVar16 != (Span *)0x0) {
        iVar24 = pSVar16->m_top;
        iVar23 = pSVar16->m_left;
        iVar9 = pSVar16->m_bottom;
        iVar15 = pSVar16->m_right;
      }
      iVar9 = (iVar9 - iVar24) + 1;
      if ((1 < (iVar15 - iVar23) + 1) || (1 < iVar9)) {
        iVar8 = QTableViewPrivate::sectionSpanEndLogical
                          (pQVar26,this_01->verticalHeader,iVar24,iVar9);
        iVar8 = QHeaderView::visualIndex(this_01->verticalHeader,iVar8);
      }
    }
    if (iVar8 < iVar14) {
      iVar8 = iVar8 + 1;
      iVar9 = QHeaderView::logicalIndex(this_01->verticalHeader,iVar8);
      iVar15 = QHeaderView::logicalIndex(this_01->horizontalHeader,column.m_i);
      while (iVar9 != -1) {
        bVar4 = QHeaderView::isSectionHidden
                          (*(QHeaderView **)
                            (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                       super_QFrame.super_QWidget.field_0x8 + 0x588),iVar9);
        if (!bVar4) {
          pQVar25 = (this_01->super_QAbstractItemViewPrivate).model;
          QPersistentModelIndex::operator_cast_to_QModelIndex(&local_70,this_00);
          (**(code **)(*(long *)pQVar25 + 0x60))(&local_58,pQVar25,iVar9,iVar15,&local_70);
          pQVar25 = (this_01->super_QAbstractItemViewPrivate).model;
          uVar18 = (**(code **)(*(long *)pQVar25 + 0x138))(pQVar25,&local_58);
          if ((uVar18 & 0x20) != 0) break;
        }
        if (iVar14 <= iVar8) break;
        iVar8 = iVar8 + 1;
        iVar9 = QHeaderView::logicalIndex(this_01->verticalHeader,iVar8);
        iVar15 = QHeaderView::logicalIndex(this_01->horizontalHeader,column.m_i);
      }
    }
    if (iVar8 < iVar14) {
      row.m_i = iVar8;
    }
    break;
  case MoveLeft:
    goto switchD_005878a6_caseD_2;
  case MoveRight:
    goto switchD_005878a6_caseD_3;
  case MoveHome:
switchD_005878a6_caseD_4:
    column.m_i = QTableViewPrivate::nextActiveVisualColumn(this_01,row.m_i,0,uVar10,Increasing);
    if (((uint)modifiers.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
               super_QFlagsStorage<Qt::KeyboardModifier>.i >> 0x1a & 1) != 0) {
      iVar9 = 0;
      searchDirection = Increasing;
      iVar14 = iVar8;
LAB_005881c8:
      row.m_i = QTableViewPrivate::nextActiveVisualRow
                          (this_01,iVar9,column.m_i,iVar14,searchDirection);
    }
    break;
  case MoveEnd:
switchD_005878a6_caseD_5:
    column.m_i = QTableViewPrivate::nextActiveVisualColumn(this_01,row.m_i,uVar10,-1,Decreasing);
    if (((uint)modifiers.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
               super_QFlagsStorage<Qt::KeyboardModifier>.i >> 0x1a & 1) != 0) {
      searchDirection = Decreasing;
      iVar14 = -1;
      iVar9 = iVar8;
      goto LAB_005881c8;
    }
    break;
  case MovePageUp:
switchD_005878a6_caseD_6:
    (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                           super_QWidget + 0x1e0))(this,&local_88);
    pQVar2 = ((this_01->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->
             data;
    iVar14 = QHeaderView::logicalIndexAt
                       (*(QHeaderView **)
                         (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                    super_QFrame.super_QWidget.field_0x8 + 0x588),
                        ~(pQVar2->crect).y2.m_i + extraout_var_00 + (pQVar2->crect).y1.m_i);
    if (iVar14 == -1) {
      iVar14 = 0;
    }
    else {
      iVar14 = QHeaderView::visualIndex(this_01->verticalHeader,iVar14);
    }
    iVar8 = QTableViewPrivate::nextActiveVisualRow(this_01,iVar14,local_88.c,iVar8,Increasing);
    iVar14 = QHeaderView::logicalIndex(this_01->verticalHeader,iVar8);
    pQVar25 = (this_01->super_QAbstractItemViewPrivate).model;
    iVar8 = local_88.c;
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_58,this_00);
    lVar17 = *(long *)pQVar25;
    goto LAB_005879a6;
  case MovePageDown:
switchD_005878a6_caseD_7:
    (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                           super_QWidget + 0x1e0))(this,&local_88);
    pQVar2 = ((this_01->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->
             data;
    iVar14 = QHeaderView::logicalIndexAt
                       (*(QHeaderView **)
                         (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                    super_QFrame.super_QWidget.field_0x8 + 0x588),
                        ((extraout_var + (pQVar2->crect).y2.m_i) - (pQVar2->crect).y1.m_i) + 1);
    if (iVar14 != -1) {
      iVar8 = QHeaderView::visualIndex(this_01->verticalHeader,iVar14);
    }
    iVar8 = QTableViewPrivate::nextActiveVisualRow(this_01,iVar8,local_88.c,-1,Decreasing);
    iVar14 = QHeaderView::logicalIndex(this_01->verticalHeader,iVar8);
    pQVar25 = (this_01->super_QAbstractItemViewPrivate).model;
    iVar8 = local_88.c;
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_58,this_00);
    lVar17 = *(long *)pQVar25;
LAB_005879a6:
    (**(code **)(lVar17 + 0x60))(__return_storage_ptr__,pQVar25,iVar14,iVar8,&local_58);
    goto LAB_00588608;
  case MoveNext:
switchD_005878a6_caseD_8:
    bVar4 = cursorAction == MoveRight;
switchD_005878a6_caseD_2:
    pQVar1 = &this_01->spans;
    bVar5 = true;
    bVar19 = false;
    uVar10 = column.m_i;
    iVar14 = row.m_i;
    do {
      iVar9 = QHeaderView::logicalIndex(this_01->verticalHeader,iVar14);
      iVar15 = QHeaderView::logicalIndex(this_01->horizontalHeader,uVar10);
      if ((bVar5) && (iVar15 != -1)) {
        if ((QSpanCollection *)
            (pQVar1->spans).
            super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>.
            _M_impl._M_node.super__List_node_base._M_next == pQVar1) {
          bVar5 = true;
        }
        else {
          pQVar26 = (QTableViewPrivate *)pQVar1;
          pSVar16 = QSpanCollection::spanAt(pQVar1,iVar15,iVar9);
          iVar23 = iVar15;
          iVar24 = iVar9;
          if (pSVar16 != (Span *)0x0) {
            iVar24 = pSVar16->m_top;
            iVar23 = pSVar16->m_left;
            iVar9 = pSVar16->m_bottom;
            iVar15 = pSVar16->m_right;
          }
          iVar15 = (iVar15 - iVar23) + 1;
          if ((1 < iVar15) || (1 < (iVar9 - iVar24) + 1)) {
            iVar9 = QTableViewPrivate::sectionSpanEndLogical
                              (pQVar26,this_01->horizontalHeader,iVar23,iVar15);
            uVar10 = QHeaderView::visualIndex(this_01->horizontalHeader,iVar9);
          }
          bVar5 = false;
        }
      }
      if ((int)uVar10 < (int)uVar3) {
        do {
          uVar27 = uVar10;
          uVar10 = uVar27 + 1;
          iVar9 = QHeaderView::logicalIndex(this_01->verticalHeader,iVar14);
          iVar15 = QHeaderView::logicalIndex(this_01->horizontalHeader,uVar10);
          if ((iVar9 == -1) || (iVar15 == -1)) break;
          bVar6 = QHeaderView::isSectionHidden
                            (*(QHeaderView **)
                              (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                         super_QFrame.super_QWidget.field_0x8 + 0x588),iVar9);
          if ((!bVar6) &&
             (bVar6 = QHeaderView::isSectionHidden
                                (*(QHeaderView **)
                                  (*(long *)&(this->super_QAbstractItemView).
                                             super_QAbstractScrollArea.super_QFrame.super_QWidget.
                                             field_0x8 + 0x580),iVar15), !bVar6)) {
            pQVar25 = (this_01->super_QAbstractItemViewPrivate).model;
            QPersistentModelIndex::operator_cast_to_QModelIndex(&local_70,this_00);
            (**(code **)(*(long *)pQVar25 + 0x60))(&local_58,pQVar25,iVar9,iVar15,&local_70);
            pQVar25 = (this_01->super_QAbstractItemViewPrivate).model;
            uVar18 = (**(code **)(*(long *)pQVar25 + 0x138))(pQVar25,&local_58);
            if ((uVar18 & 0x20) != 0) break;
          }
          if (bVar19) {
            if ((iVar14 < row.m_i) || (row.m_i == iVar14 && (int)uVar27 < column.m_i)) {
              uVar10 = uVar27 + 1;
              if (!bVar4 && (int)uVar3 <= (int)uVar10) {
                iVar9 = iVar14 + 1;
                bVar4 = iVar14 != iVar8;
                iVar14 = 0;
                if (bVar4) {
                  iVar14 = iVar9;
                }
                uVar10 = 0xffffffff;
              }
              goto LAB_005883b0;
            }
          }
        } while ((int)uVar10 < (int)uVar3);
        uVar10 = uVar27 + 1;
      }
      if ((int)uVar10 < (int)uVar3 || bVar4) goto LAB_005883b0;
      bVar6 = iVar14 == iVar8;
      iVar14 = iVar14 + 1;
      if (bVar6) {
        iVar14 = 0;
      }
      bVar19 = (bool)(bVar19 | bVar6);
      uVar10 = 0xffffffff;
    } while( true );
  case MovePrevious:
switchD_005878a6_caseD_9:
    bVar4 = cursorAction == MoveLeft;
switchD_005878a6_caseD_3:
    pQVar1 = &this_01->spans;
    bVar5 = true;
    bVar19 = false;
    uVar10 = column.m_i;
    iVar14 = row.m_i;
    do {
      iVar9 = QHeaderView::logicalIndex(this_01->verticalHeader,iVar14);
      iVar15 = QHeaderView::logicalIndex(this_01->horizontalHeader,uVar10);
      if ((bVar5) && (iVar15 != -1)) {
        if ((QSpanCollection *)
            (pQVar1->spans).
            super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>.
            _M_impl._M_node.super__List_node_base._M_next == pQVar1) {
          bVar5 = true;
        }
        else {
          pSVar16 = QSpanCollection::spanAt(pQVar1,iVar15,iVar9);
          iVar23 = iVar15;
          iVar24 = iVar9;
          if (pSVar16 != (Span *)0x0) {
            iVar24 = pSVar16->m_top;
            iVar23 = pSVar16->m_left;
            iVar9 = pSVar16->m_bottom;
            iVar15 = pSVar16->m_right;
          }
          if (((iVar15 - iVar23) + 1 < 2) && ((iVar9 - iVar24) + 1 < 2)) {
            bVar5 = false;
          }
          else {
            uVar10 = QHeaderView::visualIndex(this_01->horizontalHeader,iVar23);
            bVar5 = false;
          }
        }
      }
      uVar27 = uVar10;
      if (-1 < (int)uVar10) {
        do {
          uVar10 = uVar27 - 1;
          iVar9 = QHeaderView::logicalIndex(this_01->verticalHeader,iVar14);
          iVar15 = QHeaderView::logicalIndex(this_01->horizontalHeader,uVar10);
          if ((iVar9 == -1) || (iVar15 == -1)) goto LAB_00587be5;
          bVar6 = QHeaderView::isSectionHidden
                            (*(QHeaderView **)
                              (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                         super_QFrame.super_QWidget.field_0x8 + 0x588),iVar9);
          if ((!bVar6) &&
             (bVar6 = QHeaderView::isSectionHidden
                                (*(QHeaderView **)
                                  (*(long *)&(this->super_QAbstractItemView).
                                             super_QAbstractScrollArea.super_QFrame.super_QWidget.
                                             field_0x8 + 0x580),iVar15), !bVar6)) {
            pQVar25 = (this_01->super_QAbstractItemViewPrivate).model;
            QPersistentModelIndex::operator_cast_to_QModelIndex(&local_70,this_00);
            (**(code **)(*(long *)pQVar25 + 0x60))(&local_58,pQVar25,iVar9,iVar15,&local_70);
            pQVar25 = (this_01->super_QAbstractItemViewPrivate).model;
            uVar18 = (**(code **)(*(long *)pQVar25 + 0x138))(pQVar25,&local_58);
            if ((uVar18 & 0x20) != 0) goto LAB_00587be5;
          }
          if (bVar19) {
            if ((row.m_i < iVar14) || (row.m_i == iVar14 && column.m_i < (int)uVar27)) {
              if (bVar4 || 0 < (int)uVar27) {
                uVar10 = uVar27 - 1;
              }
              else {
                bVar4 = iVar14 == 0;
                uVar10 = uVar3;
                iVar14 = iVar14 + -1;
                if (bVar4) {
                  iVar14 = iVar8;
                }
              }
              goto LAB_005883bf;
            }
          }
          uVar27 = uVar10;
        } while (uVar10 != 0xffffffff);
        uVar10 = 0xffffffff;
      }
LAB_00587be5:
      if (-1 < (int)uVar10 || bVar4) goto LAB_005883bf;
      bVar6 = iVar14 == 0;
      iVar14 = iVar14 + -1;
      if (bVar6) {
        iVar14 = iVar8;
      }
      bVar19 = (bool)(bVar19 | bVar6);
      uVar10 = uVar3;
    } while( true );
  }
switchD_005878a6_default:
  QVar22.yp.m_i = row.m_i;
  QVar22.xp.m_i = column.m_i;
  this_01->visualCursor = QVar22;
  iVar8 = QHeaderView::logicalIndex(this_01->verticalHeader,row.m_i);
  uVar10 = QHeaderView::logicalIndex(this_01->horizontalHeader,column.m_i);
  pQVar25 = (this_01->super_QAbstractItemViewPrivate).model;
  QPersistentModelIndex::operator_cast_to_QModelIndex(&local_58,this_00);
  cVar7 = QAbstractItemModel::hasIndex((int)pQVar25,iVar8,(QModelIndex *)(ulong)uVar10);
  if (cVar7 != '\0') {
    local_58.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
    pQVar25 = (this_01->super_QAbstractItemViewPrivate).model;
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_70,this_00);
    (**(code **)(*(long *)pQVar25 + 0x60))(&local_58,pQVar25,iVar8,uVar10,&local_70);
    bVar4 = QHeaderView::isSectionHidden(this_01->verticalHeader,iVar8);
    if (((!bVar4) &&
        (bVar4 = QHeaderView::isSectionHidden(this_01->horizontalHeader,uVar10), !bVar4)) &&
       (pQVar25 = (this_01->super_QAbstractItemViewPrivate).model,
       uVar18 = (**(code **)(*(long *)pQVar25 + 0x138))(pQVar25,&local_58), (uVar18 & 0x20) != 0)) {
      if ((QSpanCollection *)
          (this_01->spans).spans.
          super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>.
          _M_impl._M_node.super__List_node_base._M_next != &this_01->spans) {
        iVar8 = local_58.r;
        iVar14 = local_58.c;
        pSVar16 = QSpanCollection::spanAt(&this_01->spans,local_58.c,local_58.r);
        iVar9 = iVar14;
        iVar15 = iVar8;
        if (pSVar16 != (Span *)0x0) {
          iVar15 = pSVar16->m_top;
          iVar9 = pSVar16->m_left;
          iVar8 = pSVar16->m_bottom;
          iVar14 = pSVar16->m_right;
        }
        if ((1 < (iVar14 - iVar9) + 1) || (1 < (iVar8 - iVar15) + 1)) {
          (**(code **)(*(long *)(this_01->super_QAbstractItemViewPrivate).model + 0x70))(&local_70);
          local_58.m.ptr = local_70.m.ptr;
          local_58.r = local_70.r;
          local_58.c = local_70.c;
          local_58.i = local_70.i;
        }
      }
      (__return_storage_ptr__->m).ptr = local_58.m.ptr;
      __return_storage_ptr__->r = local_58.r;
      __return_storage_ptr__->c = local_58.c;
      *(undefined4 *)&__return_storage_ptr__->i = (undefined4)local_58.i;
      *(undefined4 *)((long)&__return_storage_ptr__->i + 4) = local_58.i._4_4_;
      goto LAB_00588608;
    }
  }
LAB_005885f8:
  __return_storage_ptr__->r = -1;
  __return_storage_ptr__->c = -1;
  __return_storage_ptr__->i = 0;
  (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)0x0;
LAB_00588608:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
LAB_005883bf:
  row.m_i = iVar14;
  if (-1 < (int)uVar10) {
    column.m_i = uVar10;
  }
  goto switchD_005878a6_default;
LAB_005883b0:
  row.m_i = iVar14;
  if ((int)uVar10 < (int)uVar3) {
    column.m_i = uVar10;
  }
  goto switchD_005878a6_default;
}

Assistant:

QModelIndex QTableView::moveCursor(CursorAction cursorAction, Qt::KeyboardModifiers modifiers)
{
    Q_D(QTableView);
    Q_UNUSED(modifiers);

    int bottom = d->model->rowCount(d->root) - 1;
    // make sure that bottom is the bottommost *visible* row
    while (bottom >= 0 && isRowHidden(d->logicalRow(bottom)))
        --bottom;

    int right = d->model->columnCount(d->root) - 1;

    while (right >= 0 && isColumnHidden(d->logicalColumn(right)))
        --right;

    if (bottom == -1 || right == -1)
        return QModelIndex(); // model is empty

    QModelIndex current = currentIndex();

    if (!current.isValid()) {
        int row = 0;
        int column = 0;
        while (column < right && isColumnHidden(d->logicalColumn(column)))
            ++column;
        while (isRowHidden(d->logicalRow(row)) && row < bottom)
            ++row;
        d->visualCursor = QPoint(column, row);
        return d->model->index(d->logicalRow(row), d->logicalColumn(column), d->root);
    }

    // Update visual cursor if current index has changed.
    QPoint visualCurrent(d->visualColumn(current.column()), d->visualRow(current.row()));
    if (visualCurrent != d->visualCursor) {
        if (d->hasSpans()) {
            QSpanCollection::Span span = d->span(current.row(), current.column());
            if (span.top() > d->visualCursor.y() || d->visualCursor.y() > span.bottom()
                || span.left() > d->visualCursor.x() || d->visualCursor.x() > span.right())
                d->visualCursor = visualCurrent;
        } else {
            d->visualCursor = visualCurrent;
        }
    }

    int visualRow = d->visualCursor.y();
    if (visualRow > bottom)
        visualRow = bottom;
    Q_ASSERT(visualRow != -1);
    int visualColumn = d->visualCursor.x();
    if (visualColumn > right)
        visualColumn = right;
    Q_ASSERT(visualColumn != -1);

    if (isRightToLeft()) {
        if (cursorAction == MoveLeft)
            cursorAction = MoveRight;
        else if (cursorAction == MoveRight)
            cursorAction = MoveLeft;
    }

    switch (cursorAction) {
    case MoveUp: {
        int originalRow = visualRow;
#ifdef QT_KEYPAD_NAVIGATION
        if (QApplicationPrivate::keypadNavigationEnabled() && visualRow == 0)
            visualRow = d->visualRow(model()->rowCount() - 1) + 1;
            // FIXME? visualRow = bottom + 1;
#endif
        int r = d->logicalRow(visualRow);
        int c = d->logicalColumn(visualColumn);
        if (r != -1 && d->hasSpans()) {
            QSpanCollection::Span span = d->span(r, c);
            if (span.width() > 1 || span.height() > 1)
                visualRow = d->visualRow(span.top());
        }
        while (visualRow >= 0) {
            --visualRow;
            r = d->logicalRow(visualRow);
            c = d->logicalColumn(visualColumn);
            if (r == -1 || (!isRowHidden(r) && d->isCellEnabled(r, c)))
                break;
        }
        if (visualRow < 0)
            visualRow = originalRow;
        break;
    }
    case MoveDown: {
        int originalRow = visualRow;
        if (d->hasSpans()) {
            QSpanCollection::Span span = d->span(current.row(), current.column());
            visualRow = d->visualRow(d->rowSpanEndLogical(span.top(), span.height()));
        }
#ifdef QT_KEYPAD_NAVIGATION
        if (QApplicationPrivate::keypadNavigationEnabled() && visualRow >= bottom)
            visualRow = -1;
#endif
        int r = d->logicalRow(visualRow);
        int c = d->logicalColumn(visualColumn);
        if (r != -1 && d->hasSpans()) {
            QSpanCollection::Span span = d->span(r, c);
            if (span.width() > 1 || span.height() > 1)
                visualRow = d->visualRow(d->rowSpanEndLogical(span.top(), span.height()));
        }
        while (visualRow <= bottom) {
            ++visualRow;
            r = d->logicalRow(visualRow);
            c = d->logicalColumn(visualColumn);
            if (r == -1 || (!isRowHidden(r) && d->isCellEnabled(r, c)))
                break;
        }
        if (visualRow > bottom)
            visualRow = originalRow;
        break;
    }
    case MovePrevious:
    case MoveLeft: {
        int originalRow = visualRow;
        int originalColumn = visualColumn;
        bool firstTime = true;
        bool looped = false;
        bool wrapped = false;
        do {
            int r = d->logicalRow(visualRow);
            int c = d->logicalColumn(visualColumn);
            if (firstTime && c != -1 && d->hasSpans()) {
                firstTime = false;
                QSpanCollection::Span span = d->span(r, c);
                if (span.width() > 1 || span.height() > 1)
                    visualColumn = d->visualColumn(span.left());
            }
            while (visualColumn >= 0) {
                --visualColumn;
                r = d->logicalRow(visualRow);
                c = d->logicalColumn(visualColumn);
                if (r == -1 || c == -1 || (!isRowHidden(r) && !isColumnHidden(c) && d->isCellEnabled(r, c)))
                    break;
                if (wrapped && (originalRow < visualRow || (originalRow == visualRow && originalColumn <= visualColumn))) {
                    looped = true;
                    break;
                }
            }
            if (cursorAction == MoveLeft || visualColumn >= 0)
                break;
            visualColumn = right + 1;
            if (visualRow == 0) {
                wrapped = true;
                visualRow = bottom;
            } else {
                --visualRow;
            }
        } while (!looped);
        if (visualColumn < 0)
            visualColumn = originalColumn;
        break;
    }
    case MoveNext:
    case MoveRight: {
        int originalRow = visualRow;
        int originalColumn = visualColumn;
        bool firstTime = true;
        bool looped = false;
        bool wrapped = false;
        do {
            int r = d->logicalRow(visualRow);
            int c = d->logicalColumn(visualColumn);
            if (firstTime && c != -1 && d->hasSpans()) {
                firstTime = false;
                QSpanCollection::Span span = d->span(r, c);
                if (span.width() > 1 || span.height() > 1)
                    visualColumn = d->visualColumn(d->columnSpanEndLogical(span.left(), span.width()));
            }
            while (visualColumn <= right) {
                ++visualColumn;
                r = d->logicalRow(visualRow);
                c = d->logicalColumn(visualColumn);
                if (r == -1 || c == -1 || (!isRowHidden(r) && !isColumnHidden(c) && d->isCellEnabled(r, c)))
                    break;
                if (wrapped && (originalRow > visualRow || (originalRow == visualRow && originalColumn >= visualColumn))) {
                    looped = true;
                    break;
                }
            }
            if (cursorAction == MoveRight || visualColumn <= right)
                break;
            visualColumn = -1;
            if (visualRow == bottom) {
                wrapped = true;
                visualRow = 0;
            } else {
                ++visualRow;
            }
        } while (!looped);
        if (visualColumn > right)
            visualColumn = originalColumn;
        break;
    }
    case MoveHome:
        visualColumn = d->nextActiveVisualColumn(visualRow, 0, right,
                                                 QTableViewPrivate::SearchDirection::Increasing);
        if (modifiers & Qt::ControlModifier)
            visualRow = d->nextActiveVisualRow(0, visualColumn, bottom,
                                               QTableViewPrivate::SearchDirection::Increasing);
        break;
    case MoveEnd:
        visualColumn = d->nextActiveVisualColumn(visualRow, right, -1,
                                                 QTableViewPrivate::SearchDirection::Decreasing);
        if (modifiers & Qt::ControlModifier)
            visualRow = d->nextActiveVisualRow(bottom, visualColumn, -1,
                                               QTableViewPrivate::SearchDirection::Decreasing);
        break;
    case MovePageUp: {
        int newLogicalRow = rowAt(visualRect(current).bottom() - d->viewport->height());
        int visualRow = (newLogicalRow == -1 ? 0 : d->visualRow(newLogicalRow));
        visualRow = d->nextActiveVisualRow(visualRow, current.column(), bottom,
                                           QTableViewPrivate::SearchDirection::Increasing);
        newLogicalRow = d->logicalRow(visualRow);
        return d->model->index(newLogicalRow, current.column(), d->root);
    }
    case MovePageDown: {
        int newLogicalRow = rowAt(visualRect(current).top() + d->viewport->height());
        int visualRow = (newLogicalRow == -1 ? bottom : d->visualRow(newLogicalRow));
        visualRow = d->nextActiveVisualRow(visualRow, current.column(), -1,
                                           QTableViewPrivate::SearchDirection::Decreasing);
        newLogicalRow = d->logicalRow(visualRow);
        return d->model->index(newLogicalRow, current.column(), d->root);
    }}

    d->visualCursor = QPoint(visualColumn, visualRow);
    int logicalRow = d->logicalRow(visualRow);
    int logicalColumn = d->logicalColumn(visualColumn);
    if (!d->model->hasIndex(logicalRow, logicalColumn, d->root))
        return QModelIndex();

    QModelIndex result = d->model->index(logicalRow, logicalColumn, d->root);
    if (!d->isRowHidden(logicalRow) && !d->isColumnHidden(logicalColumn) && d->isIndexEnabled(result)) {
        if (d->hasSpans()) {
            QSpanCollection::Span span = d->span(result.row(), result.column());
            if (span.width() > 1 || span.height() > 1) {
                result = d->model->sibling(span.top(), span.left(), result);
            }
        }
        return result;
    }

    return QModelIndex();
}